

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O2

ma_uint64 ma_dr_flac_read_pcm_frames_f32(ma_dr_flac *pFlac,ma_uint64 framesToRead,float *pBufferOut)

{
  ma_uint32 *pmVar1;
  int *piVar2;
  int *piVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  byte bVar6;
  ma_uint8 mVar7;
  ma_int32 *pmVar8;
  ma_int32 *pmVar9;
  char cVar10;
  int iVar11;
  ma_bool32 mVar12;
  int iVar13;
  int iVar14;
  long lVar15;
  long lVar16;
  ma_uint64 mVar17;
  byte bVar18;
  byte bVar19;
  int iVar20;
  long lVar21;
  int iVar22;
  float *pfVar23;
  int iVar24;
  uint uVar25;
  uint uVar26;
  ulong uVar27;
  uint uVar28;
  ulong uVar29;
  ulong uVar30;
  long lVar31;
  uint uVar32;
  int iVar33;
  int iVar34;
  ulong uVar35;
  ulong uVar36;
  int iVar37;
  int iVar38;
  int iVar39;
  int iVar40;
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  int iVar49;
  uint uVar50;
  uint uVar51;
  uint uVar52;
  uint uVar53;
  uint uVar54;
  uint uVar55;
  ma_uint64 local_88;
  
  if (framesToRead == 0 || pFlac == (ma_dr_flac *)0x0) {
    local_88 = 0;
  }
  else {
    if (pBufferOut == (float *)0x0) {
      mVar17 = ma_dr_flac__seek_forward_by_pcm_frames(pFlac,framesToRead);
      return mVar17;
    }
    bVar6 = pFlac->bitsPerSample;
    uVar25 = (uint)bVar6;
    iVar38 = 0x20 - (uint)bVar6;
    iVar11 = 0x1f - (uint)bVar6;
    iVar20 = 0x17 - (uint)bVar6;
    local_88 = 0;
    do {
      while( true ) {
        if (framesToRead == 0) {
          return local_88;
        }
        uVar26 = (pFlac->currentFLACFrame).pcmFramesRemaining;
        uVar27 = (ulong)uVar26;
        if (uVar27 == 0) break;
        mVar7 = (pFlac->currentFLACFrame).header.channelAssignment;
        bVar6 = (&DAT_00191e00)[(char)mVar7];
        uVar36 = (ulong)((pFlac->currentFLACFrame).header.blockSizeInPCMFrames - uVar26);
        if (framesToRead < uVar27) {
          uVar27 = framesToRead;
        }
        uVar26 = (uint)uVar27;
        cVar10 = (char)iVar38;
        if ((0x702UL >> ((long)(char)mVar7 & 0x3fU) & 1) == 0) {
          uVar30 = (ulong)((uint)bVar6 * 4);
          pfVar23 = pBufferOut;
          for (uVar29 = 0; uVar29 != uVar27; uVar29 = uVar29 + 1) {
            for (uVar35 = 0; uVar30 != uVar35; uVar35 = uVar35 + 4) {
              *(float *)((long)pfVar23 + uVar35) =
                   (float)(*(int *)(*(long *)((long)&(pFlac->currentFLACFrame).subframes[0].
                                                     pSamplesS32 + uVar35 * 4) + uVar29 * 4 +
                                   uVar36 * 4) <<
                          ((&(pFlac->currentFLACFrame).subframes[0].wastedBitsPerSample)[uVar35 * 4]
                           + cVar10 & 0x1f)) * 4.656613e-10;
            }
            pfVar23 = (float *)((long)pfVar23 + uVar30);
          }
        }
        else {
          pmVar8 = (pFlac->currentFLACFrame).subframes[0].pSamplesS32;
          pmVar9 = (pFlac->currentFLACFrame).subframes[1].pSamplesS32;
          if (mVar7 == '\n') {
            if (((ma_dr_flac__gIsSSE2Supported & 1) == 0) || (0x18 < pFlac->bitsPerSample)) {
              lVar15 = uVar36 * 4 + 8;
              lVar21 = uVar36 * 4 + 8;
              lVar16 = (uVar27 >> 2) * 0x10;
              lVar31 = 0;
              if (uVar25 == 0x20) {
                for (; lVar16 != lVar31; lVar31 = lVar31 + 0x10) {
                  uVar4 = *(undefined8 *)((long)pmVar8 + lVar31 + uVar36 * 4);
                  uVar32 = (uint)(pFlac->currentFLACFrame).subframes[0].wastedBitsPerSample;
                  uVar5 = *(undefined8 *)((long)pmVar9 + lVar31 + uVar36 * 4);
                  uVar51 = (uint)(pFlac->currentFLACFrame).subframes[1].wastedBitsPerSample;
                  uVar28 = (uint)((ulong)uVar5 >> 0x20);
                  uVar50 = (int)uVar5 << uVar51;
                  uVar52 = uVar50 & 1 | ((int)uVar4 << uVar32) * 2;
                  uVar53 = uVar28 & 1 | (int)((ulong)uVar4 >> 0x20) * 2;
                  pfVar23 = (float *)((long)pBufferOut + lVar31 * 2);
                  *pfVar23 = (float)((int)(uVar52 + uVar50) >> 1) * 4.656613e-10;
                  pfVar23[1] = (float)((int)(uVar52 - uVar50) >> 1) * 4.656613e-10;
                  pfVar23[2] = (float)((int)(uVar53 + uVar28) >> 1) * 4.656613e-10;
                  pfVar23[3] = (float)((int)(uVar53 - uVar28) >> 1) * 4.656613e-10;
                  uVar4 = *(undefined8 *)((long)pmVar8 + lVar31 + lVar21);
                  uVar5 = *(undefined8 *)((long)pmVar9 + lVar31 + lVar15);
                  uVar28 = (uint)((ulong)uVar5 >> 0x20);
                  uVar51 = (int)uVar5 << uVar51;
                  uVar32 = uVar51 & 1 | ((int)uVar4 << uVar32) * 2;
                  uVar50 = uVar28 & 1 | (int)((ulong)uVar4 >> 0x20) * 2;
                  auVar44._0_4_ = (float)((int)(uVar32 + uVar51) >> 1) * 4.656613e-10;
                  auVar44._4_4_ = (float)((int)(uVar32 - uVar51) >> 1) * 4.656613e-10;
                  auVar44._8_4_ = (float)((int)(uVar50 + uVar28) >> 1) * 4.656613e-10;
                  auVar44._12_4_ = (float)((int)(uVar50 - uVar28) >> 1) * 4.656613e-10;
                  *(undefined1 (*) [16])((long)pBufferOut + lVar31 * 2 + 0x10) = auVar44;
                }
              }
              else {
                for (; lVar16 != lVar31; lVar31 = lVar31 + 0x10) {
                  uVar4 = *(undefined8 *)((long)pmVar8 + lVar31 + uVar36 * 4);
                  uVar32 = (uint)(pFlac->currentFLACFrame).subframes[0].wastedBitsPerSample;
                  uVar5 = *(undefined8 *)((long)pmVar9 + lVar31 + uVar36 * 4);
                  uVar51 = (uint)(pFlac->currentFLACFrame).subframes[1].wastedBitsPerSample;
                  uVar28 = (uint)((ulong)uVar5 >> 0x20);
                  uVar50 = (int)uVar5 << uVar51;
                  uVar52 = uVar50 & 1 | ((int)uVar4 << uVar32) * 2;
                  uVar53 = uVar28 & 1 | (int)((ulong)uVar4 >> 0x20) * 2;
                  pfVar23 = (float *)((long)pBufferOut + lVar31 * 2);
                  *pfVar23 = (float)(int)(uVar52 + uVar50 << iVar11) * 4.656613e-10;
                  pfVar23[1] = (float)(int)(uVar52 - uVar50) * 4.656613e-10;
                  pfVar23[2] = (float)(int)(uVar53 + uVar28) * 4.656613e-10;
                  pfVar23[3] = (float)(int)(uVar53 - uVar28) * 4.656613e-10;
                  uVar4 = *(undefined8 *)((long)pmVar8 + lVar31 + lVar21);
                  uVar5 = *(undefined8 *)((long)pmVar9 + lVar31 + lVar15);
                  uVar28 = (uint)((ulong)uVar5 >> 0x20);
                  uVar51 = (int)uVar5 << uVar51;
                  uVar32 = uVar51 & 1 | ((int)uVar4 << uVar32) * 2;
                  uVar50 = uVar28 & 1 | (int)((ulong)uVar4 >> 0x20) * 2;
                  auVar45._0_4_ = (float)(int)(uVar32 + uVar51 << iVar11) * 4.656613e-10;
                  auVar45._4_4_ = (float)(int)(uVar32 - uVar51) * 4.656613e-10;
                  auVar45._8_4_ = (float)(int)(uVar50 + uVar28) * 4.656613e-10;
                  auVar45._12_4_ = (float)(int)(uVar50 - uVar28) * 4.656613e-10;
                  *(undefined1 (*) [16])((long)pBufferOut + lVar31 * 2 + 0x10) = auVar45;
                }
              }
              for (uVar30 = (ulong)(uVar26 & 0xfffffffc); uVar30 < uVar27; uVar30 = uVar30 + 1) {
                uVar28 = pmVar9[uVar36 + uVar30] <<
                         ((pFlac->currentFLACFrame).subframes[1].wastedBitsPerSample & 0x1f);
                iVar13 = (uVar28 & 1) +
                         (pmVar8[uVar36 + uVar30] <<
                         ((pFlac->currentFLACFrame).subframes[0].wastedBitsPerSample & 0x1f)) * 2;
                *(ulong *)(pBufferOut + uVar30 * 2) =
                     CONCAT44((float)((int)(iVar13 - uVar28) >> 1) * 4.656613e-10,
                              (float)(((int)(iVar13 + uVar28) >> 1) << iVar38) * 4.656613e-10);
              }
            }
            else {
              lVar15 = (uVar27 >> 2) * 0x10;
              lVar21 = 0;
              if (uVar25 == 0x18) {
                for (; lVar15 != lVar21; lVar21 = lVar21 + 0x10) {
                  piVar2 = (int *)((long)pmVar8 + lVar21 + uVar36 * 4);
                  piVar3 = (int *)((long)pmVar9 + lVar21 + uVar36 * 4);
                  uVar28 = piVar3[1];
                  uVar32 = piVar3[2];
                  uVar51 = piVar3[3];
                  uVar50 = *piVar3 <<
                           (uint)(pFlac->currentFLACFrame).subframes[1].wastedBitsPerSample;
                  uVar52 = uVar50 & 1 |
                           (*piVar2 <<
                           (uint)(pFlac->currentFLACFrame).subframes[0].wastedBitsPerSample) * 2;
                  uVar53 = uVar28 & 1 | piVar2[1] * 2;
                  uVar54 = uVar32 & 1 | piVar2[2] * 2;
                  uVar55 = uVar51 & 1 | piVar2[3] * 2;
                  pfVar23 = (float *)((long)pBufferOut + lVar21 * 2);
                  *pfVar23 = (float)((int)(uVar52 + uVar50) >> 1) * 1.1920929e-07;
                  pfVar23[1] = (float)((int)(uVar52 - uVar50) >> 1) * 1.1920929e-07;
                  pfVar23[2] = (float)((int)(uVar53 + uVar28) >> 1) * 1.1920929e-07;
                  pfVar23[3] = (float)((int)(uVar53 - uVar28) >> 1) * 1.1920929e-07;
                  auVar42._4_4_ = (float)((int)(uVar54 - uVar32) >> 1) * 1.1920929e-07;
                  auVar42._0_4_ = (float)((int)(uVar54 + uVar32) >> 1) * 1.1920929e-07;
                  auVar42._8_4_ = (float)((int)(uVar55 + uVar51) >> 1) * 1.1920929e-07;
                  auVar42._12_4_ = (float)((int)(uVar55 - uVar51) >> 1) * 1.1920929e-07;
                  *(undefined1 (*) [16])((long)pBufferOut + lVar21 * 2 + 0x10) = auVar42;
                }
                for (uVar30 = (ulong)(uVar26 & 0xfffffffc); uVar30 < uVar27; uVar30 = uVar30 + 1) {
                  uVar28 = pmVar9[uVar36 + uVar30] <<
                           ((pFlac->currentFLACFrame).subframes[1].wastedBitsPerSample & 0x1f);
                  iVar13 = (uVar28 & 1) +
                           (pmVar8[uVar36 + uVar30] <<
                           ((pFlac->currentFLACFrame).subframes[0].wastedBitsPerSample & 0x1f)) * 2;
                  *(ulong *)(pBufferOut + uVar30 * 2) =
                       CONCAT44((float)((int)(iVar13 - uVar28) >> 1) * 1.1920929e-07,
                                (float)((int)(iVar13 + uVar28) >> 1) * 1.1920929e-07);
                }
              }
              else {
                for (; lVar15 != lVar21; lVar21 = lVar21 + 0x10) {
                  piVar2 = (int *)((long)pmVar8 + lVar21 + uVar36 * 4);
                  piVar3 = (int *)((long)pmVar9 + lVar21 + uVar36 * 4);
                  uVar28 = piVar3[1];
                  uVar32 = piVar3[2];
                  uVar51 = piVar3[3];
                  uVar50 = *piVar3 <<
                           (uint)(pFlac->currentFLACFrame).subframes[1].wastedBitsPerSample;
                  uVar52 = uVar50 & 1 |
                           (*piVar2 <<
                           (uint)(pFlac->currentFLACFrame).subframes[0].wastedBitsPerSample) * 2;
                  uVar53 = uVar28 & 1 | piVar2[1] * 2;
                  uVar54 = uVar32 & 1 | piVar2[2] * 2;
                  uVar55 = uVar51 & 1 | piVar2[3] * 2;
                  pfVar23 = (float *)((long)pBufferOut + lVar21 * 2);
                  *pfVar23 = (float)(int)(uVar52 + uVar50 << iVar20) * 1.1920929e-07;
                  pfVar23[1] = (float)(int)(uVar52 - uVar50 << iVar20) * 1.1920929e-07;
                  pfVar23[2] = (float)(int)(uVar53 + uVar28) * 1.1920929e-07;
                  pfVar23[3] = (float)(int)(uVar53 - uVar28) * 1.1920929e-07;
                  auVar48._4_4_ = (float)(int)(uVar54 - uVar32) * 1.1920929e-07;
                  auVar48._0_4_ = (float)(int)(uVar54 + uVar32) * 1.1920929e-07;
                  auVar48._8_4_ = (float)(int)(uVar55 + uVar51) * 1.1920929e-07;
                  auVar48._12_4_ = (float)(int)(uVar55 - uVar51) * 1.1920929e-07;
                  *(undefined1 (*) [16])((long)pBufferOut + lVar21 * 2 + 0x10) = auVar48;
                }
                for (uVar30 = (ulong)(uVar26 & 0xfffffffc); uVar30 < uVar27; uVar30 = uVar30 + 1) {
                  uVar28 = pmVar9[uVar36 + uVar30] <<
                           ((pFlac->currentFLACFrame).subframes[1].wastedBitsPerSample & 0x1f);
                  iVar13 = (uVar28 & 1) +
                           (pmVar8[uVar36 + uVar30] <<
                           ((pFlac->currentFLACFrame).subframes[0].wastedBitsPerSample & 0x1f)) * 2;
                  *(ulong *)(pBufferOut + uVar30 * 2) =
                       CONCAT44((float)(int)(iVar13 - uVar28) * 1.1920929e-07,
                                (float)(int)(iVar13 + uVar28 << iVar20) * 1.1920929e-07);
                }
              }
            }
          }
          else if (mVar7 == '\t') {
            if ((ma_dr_flac__gIsSSE2Supported & 1) == 0) {
              bVar18 = (pFlac->currentFLACFrame).subframes[0].wastedBitsPerSample;
              bVar19 = (pFlac->currentFLACFrame).subframes[1].wastedBitsPerSample;
            }
            else {
              bVar18 = (pFlac->currentFLACFrame).subframes[0].wastedBitsPerSample;
              bVar19 = (pFlac->currentFLACFrame).subframes[1].wastedBitsPerSample;
              if (pFlac->bitsPerSample < 0x19) {
                iVar13 = (bVar18 - uVar25) + 0x18;
                iVar22 = (bVar19 - uVar25) + 0x18;
                for (uVar30 = 0; (uVar27 * 4 & 0xfffffffffffffff0) != uVar30; uVar30 = uVar30 + 0x10
                    ) {
                  piVar2 = (int *)((long)pmVar8 + uVar30 + uVar36 * 4);
                  iVar33 = piVar2[1];
                  iVar37 = piVar2[2];
                  iVar34 = piVar2[3];
                  piVar3 = (int *)((long)pmVar9 + uVar30 + uVar36 * 4);
                  iVar14 = piVar3[1];
                  iVar24 = piVar3[2];
                  iVar39 = piVar3[3];
                  iVar49 = *piVar3 << iVar22;
                  pfVar23 = (float *)((long)pBufferOut + uVar30 * 2);
                  *pfVar23 = (float)((*piVar2 << iVar13) + iVar49) * 1.1920929e-07;
                  pfVar23[1] = (float)iVar49 * 1.1920929e-07;
                  pfVar23[2] = (float)(iVar33 + iVar14) * 1.1920929e-07;
                  pfVar23[3] = (float)iVar14 * 1.1920929e-07;
                  auVar41._4_4_ = (float)iVar24 * 1.1920929e-07;
                  auVar41._0_4_ = (float)(iVar37 + iVar24) * 1.1920929e-07;
                  auVar41._8_4_ = (float)(iVar34 + iVar39) * 1.1920929e-07;
                  auVar41._12_4_ = (float)iVar39 * 1.1920929e-07;
                  *(undefined1 (*) [16])((long)pBufferOut + uVar30 * 2 + 0x10) = auVar41;
                }
                for (uVar30 = (ulong)(uVar26 & 0xfffffffc); uVar30 < uVar27; uVar30 = uVar30 + 1) {
                  iVar33 = pmVar9[uVar36 + uVar30] << ((byte)iVar22 & 0x1f);
                  *(ulong *)(pBufferOut + uVar30 * 2) =
                       CONCAT44((float)iVar33 * 1.1920929e-07,
                                (float)((pmVar8[uVar36 + uVar30] << ((byte)iVar13 & 0x1f)) + iVar33)
                                * 1.1920929e-07);
                }
                goto LAB_0016572a;
              }
            }
            bVar18 = bVar18 + cVar10;
            bVar19 = bVar19 + cVar10;
            for (uVar30 = 0; (uVar27 * 4 & 0xfffffffffffffff0) != uVar30; uVar30 = uVar30 + 0x10) {
              iVar13 = *(int *)((long)pmVar8 + uVar30 + uVar36 * 4 + 4);
              iVar22 = *(int *)((long)pmVar8 + uVar30 + uVar36 * 4 + 8);
              iVar33 = *(int *)((long)pmVar8 + uVar30 + uVar36 * 4 + 0xc);
              iVar37 = *(int *)((long)pmVar9 + uVar30 + uVar36 * 4 + 8);
              iVar34 = *(int *)((long)pmVar9 + uVar30 + uVar36 * 4 + 0xc);
              iVar14 = *(int *)((long)pmVar9 + uVar30 + uVar36 * 4) << (bVar19 & 0x1f);
              iVar24 = *(int *)((long)pmVar9 + uVar30 + uVar36 * 4 + 4) << (bVar19 & 0x1f);
              pfVar23 = (float *)((long)pBufferOut + uVar30 * 2);
              *pfVar23 = (float)((*(int *)((long)pmVar8 + uVar30 + uVar36 * 4) << (bVar18 & 0x1f)) +
                                iVar14) * 4.656613e-10;
              pfVar23[1] = (float)iVar14 * 4.656613e-10;
              pfVar23[2] = (float)((iVar13 << (bVar18 & 0x1f)) + iVar24) * 4.656613e-10;
              pfVar23[3] = (float)iVar24 * 4.656613e-10;
              iVar37 = iVar37 << (bVar19 & 0x1f);
              iVar34 = iVar34 << (bVar19 & 0x1f);
              auVar46._0_4_ = (float)((iVar22 << (bVar18 & 0x1f)) + iVar37) * 4.656613e-10;
              auVar46._4_4_ = (float)iVar37 * 4.656613e-10;
              auVar46._8_4_ = (float)((iVar33 << (bVar18 & 0x1f)) + iVar34) * 4.656613e-10;
              auVar46._12_4_ = (float)iVar34 * 4.656613e-10;
              *(undefined1 (*) [16])((long)pBufferOut + uVar30 * 2 + 0x10) = auVar46;
            }
            for (uVar30 = (ulong)(uVar26 & 0xfffffffc); uVar30 < uVar27; uVar30 = uVar30 + 1) {
              iVar13 = pmVar9[uVar36 + uVar30] << (bVar19 & 0x1f);
              *(ulong *)(pBufferOut + uVar30 * 2) =
                   CONCAT44((float)iVar13 * 4.656613e-10,
                            (float)((pmVar8[uVar36 + uVar30] << (bVar18 & 0x1f)) + iVar13) *
                            4.656613e-10);
            }
          }
          else if (mVar7 == '\b') {
            if ((ma_dr_flac__gIsSSE2Supported & 1) == 0) {
              bVar18 = (pFlac->currentFLACFrame).subframes[0].wastedBitsPerSample;
              bVar19 = (pFlac->currentFLACFrame).subframes[1].wastedBitsPerSample;
            }
            else {
              bVar18 = (pFlac->currentFLACFrame).subframes[0].wastedBitsPerSample;
              bVar19 = (pFlac->currentFLACFrame).subframes[1].wastedBitsPerSample;
              if (pFlac->bitsPerSample < 0x19) {
                iVar13 = (bVar18 - uVar25) + 0x18;
                iVar22 = (bVar19 - uVar25) + 0x18;
                for (uVar30 = 0; (uVar27 * 4 & 0xfffffffffffffff0) != uVar30; uVar30 = uVar30 + 0x10
                    ) {
                  piVar2 = (int *)((long)pmVar8 + uVar30 + uVar36 * 4);
                  iVar33 = piVar2[1];
                  iVar37 = piVar2[2];
                  iVar34 = piVar2[3];
                  iVar40 = *piVar2 << iVar13;
                  piVar2 = (int *)((long)pmVar9 + uVar30 + uVar36 * 4);
                  iVar14 = *piVar2;
                  iVar24 = piVar2[1];
                  iVar39 = piVar2[2];
                  iVar49 = piVar2[3];
                  pfVar23 = (float *)((long)pBufferOut + uVar30 * 2);
                  *pfVar23 = (float)iVar40 * 1.1920929e-07;
                  pfVar23[1] = (float)(iVar40 - (iVar14 << iVar22)) * 1.1920929e-07;
                  pfVar23[2] = (float)iVar33 * 1.1920929e-07;
                  pfVar23[3] = (float)(iVar33 - iVar24) * 1.1920929e-07;
                  pfVar23 = (float *)((long)pBufferOut + uVar30 * 2 + 0x10);
                  *pfVar23 = (float)iVar37 * 1.1920929e-07;
                  pfVar23[1] = (float)(iVar37 - iVar39) * 1.1920929e-07;
                  pfVar23[2] = (float)iVar34 * 1.1920929e-07;
                  pfVar23[3] = (float)(iVar34 - iVar49) * 1.1920929e-07;
                }
                for (uVar30 = (ulong)(uVar26 & 0xfffffffc); uVar30 < uVar27; uVar30 = uVar30 + 1) {
                  iVar33 = pmVar8[uVar36 + uVar30] << ((byte)iVar13 & 0x1f);
                  *(ulong *)(pBufferOut + uVar30 * 2) =
                       CONCAT44((float)(iVar33 - (pmVar9[uVar36 + uVar30] << ((byte)iVar22 & 0x1f)))
                                * 1.1920929e-07,(float)iVar33 * 1.1920929e-07);
                }
                goto LAB_0016572a;
              }
            }
            bVar18 = bVar18 + cVar10;
            bVar19 = bVar19 + cVar10;
            for (uVar30 = 0; (uVar27 * 4 & 0xfffffffffffffff0) != uVar30; uVar30 = uVar30 + 0x10) {
              iVar13 = *(int *)((long)pmVar9 + uVar30 + uVar36 * 4);
              iVar22 = *(int *)((long)pmVar9 + uVar30 + uVar36 * 4 + 4);
              iVar33 = *(int *)((long)pmVar9 + uVar30 + uVar36 * 4 + 8);
              iVar37 = *(int *)((long)pmVar8 + uVar30 + uVar36 * 4 + 8);
              iVar34 = *(int *)((long)pmVar8 + uVar30 + uVar36 * 4 + 0xc);
              iVar14 = *(int *)((long)pmVar9 + uVar30 + uVar36 * 4 + 0xc);
              iVar24 = *(int *)((long)pmVar8 + uVar30 + uVar36 * 4) << (bVar18 & 0x1f);
              iVar39 = *(int *)((long)pmVar8 + uVar30 + uVar36 * 4 + 4) << (bVar18 & 0x1f);
              pfVar23 = (float *)((long)pBufferOut + uVar30 * 2);
              *pfVar23 = (float)iVar24 * 4.656613e-10;
              pfVar23[1] = (float)(iVar24 - (iVar13 << (bVar19 & 0x1f))) * 4.656613e-10;
              pfVar23[2] = (float)iVar39 * 4.656613e-10;
              pfVar23[3] = (float)(iVar39 - (iVar22 << (bVar19 & 0x1f))) * 4.656613e-10;
              iVar37 = iVar37 << (bVar18 & 0x1f);
              iVar34 = iVar34 << (bVar18 & 0x1f);
              auVar47._0_4_ = (float)iVar37 * 4.656613e-10;
              auVar47._4_4_ = (float)(iVar37 - (iVar33 << (bVar19 & 0x1f))) * 4.656613e-10;
              auVar47._8_4_ = (float)iVar34 * 4.656613e-10;
              auVar47._12_4_ = (float)(iVar34 - (iVar14 << (bVar19 & 0x1f))) * 4.656613e-10;
              *(undefined1 (*) [16])((long)pBufferOut + uVar30 * 2 + 0x10) = auVar47;
            }
            for (uVar30 = (ulong)(uVar26 & 0xfffffffc); uVar30 < uVar27; uVar30 = uVar30 + 1) {
              iVar13 = pmVar8[uVar36 + uVar30] << (bVar18 & 0x1f);
              *(ulong *)(pBufferOut + uVar30 * 2) =
                   CONCAT44((float)(iVar13 - (pmVar9[uVar36 + uVar30] << (bVar19 & 0x1f))) *
                            4.656613e-10,(float)iVar13 * 4.656613e-10);
            }
          }
          else {
            if ((ma_dr_flac__gIsSSE2Supported & 1) == 0) {
              bVar18 = (pFlac->currentFLACFrame).subframes[0].wastedBitsPerSample;
              bVar19 = (pFlac->currentFLACFrame).subframes[1].wastedBitsPerSample;
            }
            else {
              bVar18 = (pFlac->currentFLACFrame).subframes[0].wastedBitsPerSample;
              bVar19 = (pFlac->currentFLACFrame).subframes[1].wastedBitsPerSample;
              if (pFlac->bitsPerSample < 0x19) {
                iVar13 = (bVar18 - uVar25) + 0x18;
                iVar22 = (bVar19 - uVar25) + 0x18;
                for (uVar30 = 0; (uVar27 * 4 & 0xfffffffffffffff0) != uVar30; uVar30 = uVar30 + 0x10
                    ) {
                  piVar2 = (int *)((long)pmVar8 + uVar30 + uVar36 * 4);
                  iVar33 = piVar2[1];
                  iVar37 = piVar2[2];
                  iVar34 = piVar2[3];
                  piVar3 = (int *)((long)pmVar9 + uVar30 + uVar36 * 4);
                  iVar14 = *piVar3;
                  iVar24 = piVar3[1];
                  iVar39 = piVar3[2];
                  iVar49 = piVar3[3];
                  pfVar23 = (float *)((long)pBufferOut + uVar30 * 2);
                  *pfVar23 = (float)(*piVar2 << iVar13) * 1.1920929e-07;
                  pfVar23[1] = (float)(iVar14 << iVar22) * 1.1920929e-07;
                  pfVar23[2] = (float)iVar33 * 1.1920929e-07;
                  pfVar23[3] = (float)iVar24 * 1.1920929e-07;
                  auVar43._4_4_ = (float)iVar39 * 1.1920929e-07;
                  auVar43._0_4_ = (float)iVar37 * 1.1920929e-07;
                  auVar43._8_4_ = (float)iVar34 * 1.1920929e-07;
                  auVar43._12_4_ = (float)iVar49 * 1.1920929e-07;
                  *(undefined1 (*) [16])((long)pBufferOut + uVar30 * 2 + 0x10) = auVar43;
                }
                for (uVar30 = (ulong)(uVar26 & 0xfffffffc); uVar30 < uVar27; uVar30 = uVar30 + 1) {
                  pBufferOut[uVar30 * 2] =
                       (float)(pmVar8[uVar36 + uVar30] << ((byte)iVar13 & 0x1f)) * 1.1920929e-07;
                  pBufferOut[uVar30 * 2 + 1] =
                       (float)(pmVar9[uVar36 + uVar30] << ((byte)iVar22 & 0x1f)) * 1.1920929e-07;
                }
                goto LAB_0016572a;
              }
            }
            bVar18 = bVar18 + cVar10;
            bVar19 = bVar19 + cVar10;
            for (uVar30 = 0; (uVar27 * 4 & 0xfffffffffffffff0) != uVar30; uVar30 = uVar30 + 0x10) {
              iVar13 = *(int *)((long)pmVar8 + uVar30 + uVar36 * 4 + 4);
              iVar22 = *(int *)((long)pmVar8 + uVar30 + uVar36 * 4 + 8);
              iVar33 = *(int *)((long)pmVar8 + uVar30 + uVar36 * 4 + 0xc);
              iVar37 = *(int *)((long)pmVar9 + uVar30 + uVar36 * 4);
              iVar34 = *(int *)((long)pmVar9 + uVar30 + uVar36 * 4 + 4);
              iVar14 = *(int *)((long)pmVar9 + uVar30 + uVar36 * 4 + 8);
              iVar24 = *(int *)((long)pmVar9 + uVar30 + uVar36 * 4 + 0xc);
              *(float *)((long)pBufferOut + uVar30 * 2) =
                   (float)(*(int *)((long)pmVar8 + uVar30 + uVar36 * 4) << (bVar18 & 0x1f)) *
                   4.656613e-10;
              *(float *)((long)pBufferOut + uVar30 * 2 + 4) =
                   (float)(iVar37 << (bVar19 & 0x1f)) * 4.656613e-10;
              *(float *)((long)pBufferOut + uVar30 * 2 + 8) =
                   (float)(iVar13 << (bVar18 & 0x1f)) * 4.656613e-10;
              *(float *)((long)pBufferOut + uVar30 * 2 + 0xc) =
                   (float)(iVar34 << (bVar19 & 0x1f)) * 4.656613e-10;
              *(float *)((long)pBufferOut + uVar30 * 2 + 0x10) =
                   (float)(iVar22 << (bVar18 & 0x1f)) * 4.656613e-10;
              *(float *)((long)pBufferOut + uVar30 * 2 + 0x14) =
                   (float)(iVar14 << (bVar19 & 0x1f)) * 4.656613e-10;
              *(float *)((long)pBufferOut + uVar30 * 2 + 0x18) =
                   (float)(iVar33 << (bVar18 & 0x1f)) * 4.656613e-10;
              *(float *)((long)pBufferOut + uVar30 * 2 + 0x1c) =
                   (float)(iVar24 << (bVar19 & 0x1f)) * 4.656613e-10;
            }
            for (uVar30 = (ulong)(uVar26 & 0xfffffffc); uVar30 < uVar27; uVar30 = uVar30 + 1) {
              pBufferOut[uVar30 * 2] =
                   (float)(pmVar8[uVar36 + uVar30] << (bVar18 & 0x1f)) * 4.656613e-10;
              pBufferOut[uVar30 * 2 + 1] =
                   (float)(pmVar9[uVar36 + uVar30] << (bVar19 & 0x1f)) * 4.656613e-10;
            }
          }
        }
LAB_0016572a:
        local_88 = local_88 + uVar27;
        pBufferOut = pBufferOut + bVar6 * uVar27;
        pFlac->currentPCMFrame = pFlac->currentPCMFrame + uVar27;
        framesToRead = framesToRead - uVar27;
        pmVar1 = &(pFlac->currentFLACFrame).pcmFramesRemaining;
        *pmVar1 = *pmVar1 - uVar26;
      }
      mVar12 = ma_dr_flac__read_and_decode_next_flac_frame(pFlac);
    } while (mVar12 != 0);
  }
  return local_88;
}

Assistant:

MA_API ma_uint64 ma_dr_flac_read_pcm_frames_f32(ma_dr_flac* pFlac, ma_uint64 framesToRead, float* pBufferOut)
{
    ma_uint64 framesRead;
    ma_uint32 unusedBitsPerSample;
    if (pFlac == NULL || framesToRead == 0) {
        return 0;
    }
    if (pBufferOut == NULL) {
        return ma_dr_flac__seek_forward_by_pcm_frames(pFlac, framesToRead);
    }
    MA_DR_FLAC_ASSERT(pFlac->bitsPerSample <= 32);
    unusedBitsPerSample = 32 - pFlac->bitsPerSample;
    framesRead = 0;
    while (framesToRead > 0) {
        if (pFlac->currentFLACFrame.pcmFramesRemaining == 0) {
            if (!ma_dr_flac__read_and_decode_next_flac_frame(pFlac)) {
                break;
            }
        } else {
            unsigned int channelCount = ma_dr_flac__get_channel_count_from_channel_assignment(pFlac->currentFLACFrame.header.channelAssignment);
            ma_uint64 iFirstPCMFrame = pFlac->currentFLACFrame.header.blockSizeInPCMFrames - pFlac->currentFLACFrame.pcmFramesRemaining;
            ma_uint64 frameCountThisIteration = framesToRead;
            if (frameCountThisIteration > pFlac->currentFLACFrame.pcmFramesRemaining) {
                frameCountThisIteration = pFlac->currentFLACFrame.pcmFramesRemaining;
            }
            if (channelCount == 2) {
                const ma_int32* pDecodedSamples0 = pFlac->currentFLACFrame.subframes[0].pSamplesS32 + iFirstPCMFrame;
                const ma_int32* pDecodedSamples1 = pFlac->currentFLACFrame.subframes[1].pSamplesS32 + iFirstPCMFrame;
                switch (pFlac->currentFLACFrame.header.channelAssignment)
                {
                    case MA_DR_FLAC_CHANNEL_ASSIGNMENT_LEFT_SIDE:
                    {
                        ma_dr_flac_read_pcm_frames_f32__decode_left_side(pFlac, frameCountThisIteration, unusedBitsPerSample, pDecodedSamples0, pDecodedSamples1, pBufferOut);
                    } break;
                    case MA_DR_FLAC_CHANNEL_ASSIGNMENT_RIGHT_SIDE:
                    {
                        ma_dr_flac_read_pcm_frames_f32__decode_right_side(pFlac, frameCountThisIteration, unusedBitsPerSample, pDecodedSamples0, pDecodedSamples1, pBufferOut);
                    } break;
                    case MA_DR_FLAC_CHANNEL_ASSIGNMENT_MID_SIDE:
                    {
                        ma_dr_flac_read_pcm_frames_f32__decode_mid_side(pFlac, frameCountThisIteration, unusedBitsPerSample, pDecodedSamples0, pDecodedSamples1, pBufferOut);
                    } break;
                    case MA_DR_FLAC_CHANNEL_ASSIGNMENT_INDEPENDENT:
                    default:
                    {
                        ma_dr_flac_read_pcm_frames_f32__decode_independent_stereo(pFlac, frameCountThisIteration, unusedBitsPerSample, pDecodedSamples0, pDecodedSamples1, pBufferOut);
                    } break;
                }
            } else {
                ma_uint64 i;
                for (i = 0; i < frameCountThisIteration; ++i) {
                    unsigned int j;
                    for (j = 0; j < channelCount; ++j) {
                        ma_int32 sampleS32 = (ma_int32)((ma_uint32)(pFlac->currentFLACFrame.subframes[j].pSamplesS32[iFirstPCMFrame + i]) << (unusedBitsPerSample + pFlac->currentFLACFrame.subframes[j].wastedBitsPerSample));
                        pBufferOut[(i*channelCount)+j] = (float)(sampleS32 / 2147483648.0);
                    }
                }
            }
            framesRead                += frameCountThisIteration;
            pBufferOut                += frameCountThisIteration * channelCount;
            framesToRead              -= frameCountThisIteration;
            pFlac->currentPCMFrame    += frameCountThisIteration;
            pFlac->currentFLACFrame.pcmFramesRemaining -= (unsigned int)frameCountThisIteration;
        }
    }
    return framesRead;
}